

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pauth_helper.c
# Opt level: O1

uint64_t pac_cell_shuffle(uint64_t i)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (uint)(i >> 0xc);
  uVar1 = (uint)(i >> 0x20);
  return i & 0xf000000f00000000 | (ulong)((uint)(i >> 0x14) & 0xf0) | (ulong)(uVar1 >> 0x14 & 0xf) |
         (ulong)(uVar1 >> 4 & 0xf00) | (ulong)(((uint)i & 0xf) << 0xc) | (ulong)(uVar2 & 0xf0000) |
         i << 0x18 & 0xf00000000000 |
         i >> 0x10 & 0xf0000000000 |
         i << 0x18 & 0xf000000000 |
         (ulong)(uVar2 & 0xf0000000 | ((uint)i & 0xf0) << 0x14 | (uint)(i >> 0x1c) & 0xf00000) |
         i << 0x28 & 0xf00000000000000 | (i & 0xf000000000) << 0x10 | i << 0x28 & 0xf000000000000;
}

Assistant:

static uint64_t pac_cell_shuffle(uint64_t i)
{
    uint64_t o = 0;

    o |= extract64(i, 52, 4);
    o |= extract64(i, 24, 4) << 4;
    o |= extract64(i, 44, 4) << 8;
    o |= extract64(i,  0, 4) << 12;

    o |= extract64(i, 28, 4) << 16;
    o |= extract64(i, 48, 4) << 20;
    o |= extract64(i,  4, 4) << 24;
    o |= extract64(i, 40, 4) << 28;

    o |= extract64(i, 32, 4) << 32;
    o |= extract64(i, 12, 4) << 36;
    o |= extract64(i, 56, 4) << 40;
    o |= extract64(i, 20, 4) << 44;

    o |= extract64(i,  8, 4) << 48;
    o |= extract64(i, 36, 4) << 52;
    o |= extract64(i, 16, 4) << 56;
    o |= extract64(i, 60, 4) << 60;

    return o;
}